

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLib.c
# Opt level: O0

JL_STATUS JlJsonToStructEx(char *JsonString,JlMarshallElement *StructDescription,
                          size_t StructDescriptionCount,_Bool IgnoreExistingValuesInStruct,
                          _Bool AllowJson5,void *Structure,size_t *pErrorAtPos)

{
  JlDataObject *local_40;
  JlDataObject *objectTree;
  void *pvStack_30;
  JL_STATUS jlStatus;
  void *Structure_local;
  _Bool AllowJson5_local;
  size_t sStack_20;
  _Bool IgnoreExistingValuesInStruct_local;
  size_t StructDescriptionCount_local;
  JlMarshallElement *StructDescription_local;
  char *JsonString_local;
  
  if ((((JsonString == (char *)0x0) || (StructDescription == (JlMarshallElement *)0x0)) ||
      (StructDescriptionCount == 0)) || (Structure == (void *)0x0)) {
    objectTree._4_4_ = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    local_40 = (JlDataObject *)0x0;
    pvStack_30 = Structure;
    Structure_local._6_1_ = AllowJson5;
    Structure_local._7_1_ = IgnoreExistingValuesInStruct;
    sStack_20 = StructDescriptionCount;
    StructDescriptionCount_local = (size_t)StructDescription;
    StructDescription_local = (JlMarshallElement *)JsonString;
    objectTree._4_4_ = JlParseJsonEx(JsonString,AllowJson5,&local_40,pErrorAtPos);
    if (objectTree._4_4_ == JL_STATUS_SUCCESS) {
      objectTree._4_4_ =
           JlUnmarshallToStructEx
                     (local_40,(JlMarshallElement *)StructDescriptionCount_local,sStack_20,
                      (_Bool)(Structure_local._7_1_ & 1),pvStack_30,pErrorAtPos);
      JlFreeObjectTree(&local_40);
    }
  }
  return objectTree._4_4_;
}

Assistant:

JL_STATUS
    JlJsonToStructEx
    (
        char const*                 JsonString,                     // [in]
        JlMarshallElement const*    StructDescription,              // [in]
        size_t                      StructDescriptionCount,         // [in]
        bool                        IgnoreExistingValuesInStruct,   // [in]
        bool                        AllowJson5,                     // [in]
        void*                       Structure,                      // [in,out]
        size_t*                     pErrorAtPos                     // [out] [OPTIONAL]
    )
{
    JL_STATUS jlStatus;

    if(     NULL != JsonString
        &&  NULL != StructDescription
        &&  0 != StructDescriptionCount
        &&  NULL != Structure )
    {
        JlDataObject* objectTree = NULL;

        jlStatus = JlParseJsonEx( JsonString, AllowJson5, &objectTree, pErrorAtPos );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            jlStatus = JlUnmarshallToStructEx(
                objectTree,
                StructDescription, StructDescriptionCount,
                IgnoreExistingValuesInStruct,
                Structure,
                pErrorAtPos );

            // Now free the intermediate objectTree regardless of whether the unmarshall succeeded.
            (void) JlFreeObjectTree( &objectTree );
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}